

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

size_t __thiscall
QPDF::recoverStreamLength
          (QPDF *this,shared_ptr<InputSource> *input,QPDFObjGen og,qpdf_offset_t stream_offset)

{
  InputSource *pIVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  QPDF *this_00;
  bool bVar3;
  int iVar4;
  qpdf_offset_t qVar5;
  longlong lVar6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  string *this_01;
  long lVar9;
  ulong uVar10;
  size_t length;
  PatternFinder ef;
  Token t;
  unsigned_long local_148;
  qpdf_offset_t local_140;
  QPDF *local_138;
  shared_ptr<InputSource> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ulong local_108;
  QPDFObjGen local_100;
  long local_f8;
  string local_f0;
  undefined1 local_d0 [32];
  undefined1 local_b0 [128];
  
  pIVar1 = (input->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"attempting to recover stream length",(allocator<char> *)&local_128)
  ;
  damagedPDF((QPDFExc *)local_b0,this,pIVar1,stream_offset,(string *)local_d0);
  warn(this,(QPDFExc *)local_b0);
  QPDFExc::~QPDFExc((QPDFExc *)local_b0);
  std::__cxx11::string::~string((string *)local_d0);
  local_d0._0_8_ = &PTR__Finder_002b2b28;
  local_d0._16_8_ = findEndstream;
  local_d0._24_8_ = 0;
  local_148 = 0;
  local_d0._8_8_ = this;
  bVar3 = InputSource::findFirst
                    ((((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,"end",
                     stream_offset,0,(Finder *)local_d0);
  if (bVar3) {
    local_b0._0_8_ =
         (**(code **)(**(long **)&(((this->m)._M_t.
                                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                    .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                  file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                     + 0x20))();
    local_b0._0_8_ = local_b0._0_8_ - stream_offset;
    local_148 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                          ((longlong *)local_b0);
    readToken((Token *)local_b0,this,
              (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_b0 + 8),"endobj");
    if (bVar3) {
      pIVar1 = (((this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      qVar5 = InputSource::getLastOffset(pIVar1);
      (*pIVar1->_vptr_InputSource[5])(pIVar1,qVar5,0);
    }
    QPDFTokenizer::Token::~Token((Token *)local_b0);
  }
  if (local_148 != 0) {
    local_130 = input;
    lVar6 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&local_148);
    local_108 = (ulong)og >> 0x20;
    local_f8 = lVar6 + stream_offset;
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    uVar8 = 0;
    uVar10 = 0;
    lVar9 = 0;
    local_140 = stream_offset;
    local_138 = this;
    local_100 = og;
    for (p_Var7 = ((_Var2._M_head_impl)->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left; this_00 = local_138, qVar5 = local_140,
        p_Var7 != &((_Var2._M_head_impl)->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      iVar4 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var7[1]._M_parent);
      if (iVar4 == 1) {
        qVar5 = QPDFXRefEntry::getOffset((QPDFXRefEntry *)&p_Var7[1]._M_parent);
        if ((lVar9 < qVar5) && (qVar5 < local_f8)) {
          uVar8 = *(ulong *)(p_Var7 + 1);
          uVar10 = uVar8 >> 0x20;
          lVar9 = qVar5;
        }
      }
    }
    this = local_138;
    stream_offset = local_140;
    input = local_130;
    if ((lVar9 == 0) || ((int)uVar10 == (int)local_108 && (int)uVar8 == local_100.obj)) {
      if (local_148 != 0) {
        pIVar1 = (local_130->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::to_string(&local_f0,local_148);
        std::operator+(&local_128,"recovered stream length: ",&local_f0);
        damagedPDF((QPDFExc *)local_b0,this_00,pIVar1,qVar5,&local_128);
        warn(this_00,(QPDFExc *)local_b0);
        QPDFExc::~QPDFExc((QPDFExc *)local_b0);
        std::__cxx11::string::~string((string *)&local_128);
        this_01 = &local_f0;
        goto LAB_001e68c5;
      }
    }
    else {
      local_148 = 0;
    }
  }
  pIVar1 = (input->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unable to recover stream data; treating stream as empty",
             (allocator<char> *)&local_f0);
  damagedPDF((QPDFExc *)local_b0,this,pIVar1,stream_offset,&local_128);
  warn(this,(QPDFExc *)local_b0);
  QPDFExc::~QPDFExc((QPDFExc *)local_b0);
  this_01 = &local_128;
LAB_001e68c5:
  std::__cxx11::string::~string((string *)this_01);
  return local_148;
}

Assistant:

size_t
QPDF::recoverStreamLength(
    std::shared_ptr<InputSource> input, QPDFObjGen og, qpdf_offset_t stream_offset)
{
    // Try to reconstruct stream length by looking for endstream or endobj
    warn(damagedPDF(*input, stream_offset, "attempting to recover stream length"));

    PatternFinder ef(*this, &QPDF::findEndstream);
    size_t length = 0;
    if (m->file->findFirst("end", stream_offset, 0, ef)) {
        length = toS(m->file->tell() - stream_offset);
        // Reread endstream but, if it was endobj, don't skip that.
        QPDFTokenizer::Token t = readToken(*m->file);
        if (t.getValue() == "endobj") {
            m->file->seek(m->file->getLastOffset(), SEEK_SET);
        }
    }

    if (length) {
        auto end = stream_offset + toO(length);
        qpdf_offset_t found_offset = 0;
        QPDFObjGen found_og;

        // Make sure this is inside this object
        for (auto const& [current_og, entry]: m->xref_table) {
            if (entry.getType() == 1) {
                qpdf_offset_t obj_offset = entry.getOffset();
                if (found_offset < obj_offset && obj_offset < end) {
                    found_offset = obj_offset;
                    found_og = current_og;
                }
            }
        }
        if (!found_offset || found_og == og) {
            // If we are trying to recover an XRef stream the xref table will not contain and
            // won't contain any entries, therefore we cannot check the found length. Otherwise we
            // found endstream\nendobj within the space allowed for this object, so we're probably
            // in good shape.
        } else {
            QTC::TC("qpdf", "QPDF found wrong endstream in recovery");
            length = 0;
        }
    }

    if (length == 0) {
        warn(damagedPDF(
            *input, stream_offset, "unable to recover stream data; treating stream as empty"));
    } else {
        warn(damagedPDF(
            *input, stream_offset, "recovered stream length: " + std::to_string(length)));
    }

    QTC::TC("qpdf", "QPDF recovered stream length");
    return length;
}